

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_feature_filter.cpp
# Opt level: O3

int __thiscall Fossilize::FeatureFilter::Impl::init(Impl *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  undefined8 extraout_RAX;
  uint in_ECX;
  long in_RDX;
  ulong uVar2;
  void *in_R8;
  void *in_R9;
  __hashtable *__h;
  allocator local_6d;
  uint32_t local_6c;
  void *local_68;
  void *local_60;
  Impl *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_6c = (uint32_t)ctx;
  local_68 = in_R8;
  local_60 = in_R9;
  if (in_ECX != 0) {
    uVar2 = 0;
    do {
      std::__cxx11::string::string((string *)local_50,*(char **)(in_RDX + uVar2 * 8),&local_6d);
      local_58 = this;
      std::
      _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<std::__cxx11::string,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)this,(string *)local_50,&local_58);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      iVar1 = strcmp(*(char **)(in_RDX + uVar2 * 8),"VK_EXT_scalar_block_layout");
      if (iVar1 == 0) {
        (this->features).vk12.scalarBlockLayout = 1;
      }
      uVar2 = uVar2 + 1;
    } while (in_ECX != uVar2);
  }
  this->api_version = local_6c;
  memcpy(&this->props2,local_60,0x348);
  memcpy(&this->features2,local_68,0xf0);
  init_features(this,*(void **)((long)local_68 + 8));
  init_properties(this,*(void **)((long)local_60 + 8));
  return (int)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
}

Assistant:

bool FeatureFilter::Impl::init(uint32_t api_version_, const char **device_exts, unsigned count,
                               const VkPhysicalDeviceFeatures2 *enabled_features,
                               const VkPhysicalDeviceProperties2 *properties)
{
	for (unsigned i = 0; i < count; i++)
	{
		enabled_extensions.insert(device_exts[i]);
		if (strcmp(device_exts[i], VK_EXT_SCALAR_BLOCK_LAYOUT_EXTENSION_NAME) == 0)
			features.vk12.scalarBlockLayout = VK_TRUE;
	}

	api_version = api_version_;
	props2 = *properties;
	features2 = *enabled_features;

	init_features(enabled_features->pNext);
	init_properties(properties->pNext);

	return true;
}